

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O2

void VP8StoreFilterStats(VP8EncIterator *it)

{
  int iVar1;
  uint uVar2;
  VP8Encoder *pVVar3;
  uint8_t *__dest;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined1 uVar13;
  double dVar14;
  
  uVar5 = *(byte *)it->mb >> 5 & 3;
  iVar1 = it->enc->dqm[uVar5].quant;
  if (((*(byte *)it->mb & 0x13) != 0x11) && (it->lf_stats != (LFStats *)0x0)) {
    iVar8 = it->enc->dqm[uVar5].fstrength;
    iVar9 = (uint)(1 < iVar1) * 3 + 1;
    dVar14 = GetMBSSIM(it->yuv_in,it->yuv_out);
    uVar7 = (ulong)(uVar5 << 9);
    *(double *)((long)(*it->lf_stats)[0] + uVar7) =
         dVar14 + *(double *)((long)(*it->lf_stats)[0] + uVar7);
    uVar5 = iVar8 - iVar1;
    iVar11 = iVar8 * 2 + iVar1 * -2;
    for (iVar8 = -iVar1; iVar8 <= iVar1; iVar8 = iVar8 + iVar9) {
      if (0xffffffc0 < uVar5 - 0x40) {
        pVVar3 = it->enc;
        uVar2 = pVVar3->config->filter_sharpness;
        uVar10 = uVar5;
        if (0 < (int)uVar2) {
          uVar6 = uVar5 >> (2U - (uVar2 < 5) & 0x1f);
          uVar10 = 9 - uVar2;
          if ((int)uVar6 < (int)(9 - uVar2)) {
            uVar10 = uVar6;
          }
        }
        if ((int)uVar10 < 2) {
          uVar10 = 1;
        }
        iVar12 = iVar11 + uVar10;
        __dest = it->yuv_out2;
        memcpy(__dest,it->yuv_out,0x200);
        if ((pVVar3->filter_hdr).simple == 1) {
          (*VP8SimpleHFilter16i)(__dest,0x20,iVar12);
          (*VP8SimpleVFilter16i)(__dest,0x20,iVar12);
        }
        else {
          uVar13 = 0xe < uVar5;
          if (0x27 < uVar5) {
            uVar13 = 2;
          }
          iVar4 = (int)uVar13;
          (*VP8HFilter16i)(__dest,0x20,iVar12,uVar10,iVar4);
          (*VP8HFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar12,uVar10,iVar4);
          (*VP8VFilter16i)(__dest,0x20,iVar12,uVar10,iVar4);
          (*VP8VFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar12,uVar10,iVar4);
        }
        dVar14 = GetMBSSIM(it->yuv_in,it->yuv_out2);
        *(double *)((long)(*it->lf_stats)[0] + (ulong)uVar5 * 8 + uVar7) =
             dVar14 + *(double *)((long)(*it->lf_stats)[0] + (ulong)uVar5 * 8 + uVar7);
      }
      uVar5 = uVar5 + iVar9;
      iVar11 = iVar11 + iVar9 * 2;
    }
  }
  return;
}

Assistant:

void VP8StoreFilterStats(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  int d;
  VP8Encoder* const enc = it->enc;
  const int s = it->mb->segment;
  const int level0 = enc->dqm[s].fstrength;

  // explore +/-quant range of values around level0
  const int delta_min = -enc->dqm[s].quant;
  const int delta_max = enc->dqm[s].quant;
  const int step_size = (delta_max - delta_min >= 4) ? 4 : 1;

  if (it->lf_stats == NULL) return;

  // NOTE: Currently we are applying filter only across the sublock edges
  // There are two reasons for that.
  // 1. Applying filter on macro block edges will change the pixels in
  // the left and top macro blocks. That will be hard to restore
  // 2. Macro Blocks on the bottom and right are not yet compressed. So we
  // cannot apply filter on the right and bottom macro block edges.
  if (it->mb->type == 1 && it->mb->skip) return;

  // Always try filter level  zero
  (*it->lf_stats)[s][0] += GetMBSSIM(it->yuv_in, it->yuv_out);

  for (d = delta_min; d <= delta_max; d += step_size) {
    const int level = level0 + d;
    if (level <= 0 || level >= MAX_LF_LEVELS) {
      continue;
    }
    DoFilter(it, level);
    (*it->lf_stats)[s][level] += GetMBSSIM(it->yuv_in, it->yuv_out2);
  }
#else  // defined(WEBP_REDUCE_SIZE)
  (void)it;
#endif  // !defined(WEBP_REDUCE_SIZE)
}